

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Var.cpp
# Opt level: O0

void __thiscall asl::Var::Var(Var *this,Type t)

{
  Type t_local;
  Var *this_local;
  
  this->_type = t;
  switch(t) {
  case SSTRING:
    (this->field_1)._b = false;
    break;
  default:
    break;
  case STRING:
    StaticSpace<asl::Array<char>_>::construct(&(this->field_1)._s);
    break;
  case ARRAY:
    StaticSpace<asl::Array<asl::Var>_>::construct(&(this->field_1)._a);
    break;
  case DIC:
    StaticSpace<asl::Dic<asl::Var>_>::construct(&(this->field_1)._o);
  }
  return;
}

Assistant:

Var::Var(Type t)
{
	switch(_type=t)
	{
	case SSTRING: _ss[0] = '\0'; break;
	case STRING: NEW_STRING(_s); break;
	case ARRAY: NEW_ARRAY(_a); break;
	case OBJ: NEW_DIC(_o); break;
	default: break;
	}
}